

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O0

void __thiscall tokenizer::load_token_name_id(tokenizer *this)

{
  mapped_type *pmVar1;
  key_type local_c0 [44];
  tokenizer *local_10;
  tokenizer *this_local;
  
  local_c0[0x2b] = 1000;
  local_10 = this;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x2b);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SPACES");
  local_c0[0x2a] = 0x3e9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x2a);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_CR");
  local_c0[0x29] = 0x3ea;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x29);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_LF");
  local_c0[0x28] = 0x3eb;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x28);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_EOL");
  local_c0[0x27] = 0x3ec;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x27);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_LINE_BREAK_CR");
  local_c0[0x26] = 0x3ed;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x26);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_LINE_BREAK_LF");
  local_c0[0x25] = 0x3ee;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x25);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_LINE_BREAK_EOL");
  local_c0[0x24] = 0x3ef;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x24);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_SHARP");
  local_c0[0x23] = 0x3f0;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x23);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_EXCLAMATION");
  local_c0[0x22] = 0x3f1;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x22);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_CHARS");
  local_c0[0x21] = 0x3f2;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x21);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_SPACES");
  local_c0[0x20] = 0x3f3;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x20);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_CR");
  local_c0[0x1f] = 0x3f4;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1f);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_LF");
  local_c0[0x1e] = 0x3f5;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1e);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_COMMENT_EOL");
  local_c0[0x1d] = 0x3f6;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1d);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_CHARS");
  local_c0[0x1c] = 0x3f7;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1c);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_ESCAPE_CHAR");
  local_c0[0x1b] = 0x3f8;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1b);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_UNICODE");
  local_c0[0x1a] = 0x3f9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x1a);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_BAD_UNICODE");
  local_c0[0x19] = 0x3fa;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x19);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_CR");
  local_c0[0x18] = 0x3fb;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x18);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_LF");
  local_c0[0x17] = 0x3fc;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x17);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_EOL");
  local_c0[0x16] = 0x3fd;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x16);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_LINE_BREAK_CR");
  local_c0[0x15] = 0x3fe;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x15);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_LINE_BREAK_LF");
  local_c0[0x14] = 0x3ff;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x14);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_KEY_LINE_BREAK_EOL");
  local_c0[0x13] = 0x400;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x13);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_COLON");
  local_c0[0x12] = 0x401;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x12);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_EQUAL");
  local_c0[0x11] = 0x402;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x11);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_SPACES");
  local_c0[0x10] = 0x403;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0x10);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_CR");
  local_c0[0xf] = 0x404;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0xf);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_LF");
  local_c0[0xe] = 0x405;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0xe);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_EOL");
  local_c0[0xd] = 0x406;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0xd);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_LINE_BREAK_CR");
  local_c0[0xc] = 0x407;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0xc);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_LINE_BREAK_LF");
  local_c0[0xb] = 0x408;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 0xb);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_SEPARATOR_LINE_BREAK_EOL");
  local_c0[10] = 0x409;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 10);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_SPACES");
  local_c0[9] = 0x40a;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 9);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_CHARS");
  local_c0[8] = 0x40b;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 8);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_ESCAPE_CHAR");
  local_c0[7] = 0x40c;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 7);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_UNICODE");
  local_c0[6] = 0x40d;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 6);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_BAD_UNICODE");
  local_c0[5] = 0x40e;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 5);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_CR");
  local_c0[4] = 0x40f;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 4);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_LF");
  local_c0[3] = 0x410;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 3);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_EOL");
  local_c0[2] = 0x411;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 2);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_LINE_BREAK_CR");
  local_c0[1] = 0x412;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0 + 1);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_LINE_BREAK_LF");
  local_c0[0] = 0x413;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->name,local_c0);
  std::__cxx11::string::operator=((string *)pmVar1,"ID_VALUE_LINE_BREAK_EOL");
  return;
}

Assistant:

void load_token_name_id() {
        name[ID_SPACES]                   = "ID_SPACES";
        name[ID_CR]                       = "ID_CR";
        name[ID_LF]                       = "ID_LF";
        name[ID_EOL]                      = "ID_EOL";
        name[ID_LINE_BREAK_CR]            = "ID_LINE_BREAK_CR";
        name[ID_LINE_BREAK_LF]            = "ID_LINE_BREAK_LF";
        name[ID_LINE_BREAK_EOL]           = "ID_LINE_BREAK_EOL";
        name[ID_COMMENT_SHARP]            = "ID_COMMENT_SHARP";
        name[ID_COMMENT_EXCLAMATION]      = "ID_COMMENT_EXCLAMATION";
        name[ID_COMMENT_CHARS]            = "ID_COMMENT_CHARS";
        name[ID_COMMENT_SPACES]           = "ID_COMMENT_SPACES";
        name[ID_COMMENT_CR]               = "ID_COMMENT_CR";
        name[ID_COMMENT_LF]               = "ID_COMMENT_LF";
        name[ID_COMMENT_EOL]              = "ID_COMMENT_EOL";
        name[ID_KEY_CHARS]                = "ID_KEY_CHARS";
        name[ID_KEY_ESCAPE_CHAR]          = "ID_KEY_ESCAPE_CHAR";
        name[ID_KEY_UNICODE]              = "ID_KEY_UNICODE";
        name[ID_KEY_BAD_UNICODE]          = "ID_KEY_BAD_UNICODE";
        name[ID_KEY_CR]                   = "ID_KEY_CR";
        name[ID_KEY_LF]                   = "ID_KEY_LF";
        name[ID_KEY_EOL]                  = "ID_KEY_EOL";
        name[ID_KEY_LINE_BREAK_CR]        = "ID_KEY_LINE_BREAK_CR";
        name[ID_KEY_LINE_BREAK_LF]        = "ID_KEY_LINE_BREAK_LF";
        name[ID_KEY_LINE_BREAK_EOL]       = "ID_KEY_LINE_BREAK_EOL";
        name[ID_SEPARATOR_COLON]          = "ID_SEPARATOR_COLON";
        name[ID_SEPARATOR_EQUAL]          = "ID_SEPARATOR_EQUAL";
        name[ID_SEPARATOR_SPACES]         = "ID_SEPARATOR_SPACES";
        name[ID_SEPARATOR_CR]             = "ID_SEPARATOR_CR";
        name[ID_SEPARATOR_LF]             = "ID_SEPARATOR_LF";
        name[ID_SEPARATOR_EOL]            = "ID_SEPARATOR_EOL";
        name[ID_SEPARATOR_LINE_BREAK_CR]  = "ID_SEPARATOR_LINE_BREAK_CR";
        name[ID_SEPARATOR_LINE_BREAK_LF]  = "ID_SEPARATOR_LINE_BREAK_LF";
        name[ID_SEPARATOR_LINE_BREAK_EOL] = "ID_SEPARATOR_LINE_BREAK_EOL";
        name[ID_VALUE_SPACES]             = "ID_VALUE_SPACES";
        name[ID_VALUE_CHARS]              = "ID_VALUE_CHARS";
        name[ID_VALUE_ESCAPE_CHAR]        = "ID_VALUE_ESCAPE_CHAR";
        name[ID_VALUE_UNICODE]            = "ID_VALUE_UNICODE";
        name[ID_VALUE_BAD_UNICODE]        = "ID_VALUE_BAD_UNICODE";
        name[ID_VALUE_CR]                 = "ID_VALUE_CR";
        name[ID_VALUE_LF]                 = "ID_VALUE_LF";
        name[ID_VALUE_EOL]                = "ID_VALUE_EOL";
        name[ID_VALUE_LINE_BREAK_CR]      = "ID_VALUE_LINE_BREAK_CR";
        name[ID_VALUE_LINE_BREAK_LF]      = "ID_VALUE_LINE_BREAK_LF";
        name[ID_VALUE_LINE_BREAK_EOL]     = "ID_VALUE_LINE_BREAK_EOL";
    }